

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

float __thiscall Assimp::BVHLoader::GetNextTokenAsFloat(BVHLoader *this)

{
  float fVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *this_00;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_98;
  float local_74;
  char *pcStack_70;
  float result;
  char *ctoken;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string token;
  BVHLoader *this_local;
  
  token.field_2._8_8_ = this;
  GetNextToken_abi_cxx11_((string *)local_30,this);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Unexpected end of file while trying to read a float",&local_51);
    ThrowException(this,&local_50);
  }
  pcStack_70 = (char *)std::__cxx11::string::c_str();
  local_74 = 0.0;
  pcVar3 = fast_atoreal_move<float>(pcStack_70,&local_74,true);
  pcStack_70 = pcVar3;
  lVar4 = std::__cxx11::string::c_str();
  lVar5 = std::__cxx11::string::length();
  fVar1 = local_74;
  if (pcVar3 != (char *)(lVar4 + lVar5)) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_210);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_210,(char (*) [46])"Expected a floating point number, but found \"");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    this_00 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<(pbVar6,(char (*) [3])0xa87e64);
    Formatter::basic_formatter::operator_cast_to_string(&local_98,this_00);
    ThrowException(this,&local_98);
  }
  std::__cxx11::string::~string((string *)local_30);
  return fVar1;
}

Assistant:

float BVHLoader::GetNextTokenAsFloat()
{
    std::string token = GetNextToken();
    if( token.empty())
        ThrowException( "Unexpected end of file while trying to read a float");

    // check if the float is valid by testing if the atof() function consumed every char of the token
    const char* ctoken = token.c_str();
    float result = 0.0f;
    ctoken = fast_atoreal_move<float>( ctoken, result);

    if( ctoken != token.c_str() + token.length())
        ThrowException( format() << "Expected a floating point number, but found \"" << token << "\"." );

    return result;
}